

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O2

BSDFSample * __thiscall
pbrt::DielectricInterfaceBxDF::Sample_f
          (BSDFSample *__return_storage_ptr__,DielectricInterfaceBxDF *this,Vector3f wo,Float uc,
          Point2f *u,TransportMode mode,BxDFReflTransFlags sampleFlags)

{
  undefined8 uVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  int iVar7;
  long in_FS_OFFSET;
  undefined1 auVar8 [16];
  Float FVar9;
  Float FVar10;
  float fVar11;
  Float FVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 extraout_var [60];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined4 in_XMM1_Db;
  undefined4 in_XMM1_Dd;
  undefined1 auVar27 [60];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  Vector3f VVar31;
  Vector3<float> VVar32;
  Normal3<float> NVar33;
  Tuple3<pbrt::Vector3,_float> local_d8;
  Tuple3<pbrt::Vector3,_float> local_c8;
  undefined1 local_b8 [16];
  float local_9c;
  SampledSpectrum ft;
  undefined1 local_78 [16];
  float local_68;
  Tuple3<pbrt::Normal3,_float> local_58;
  undefined1 local_48 [16];
  undefined1 auVar24 [56];
  
  local_78._0_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar17._8_56_ = wo._8_56_;
  auVar17._0_8_ = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_c8._0_8_ = vmovlps_avx(auVar17._0_16_);
  if (((float)local_78._0_4_ != 0.0) || (NAN((float)local_78._0_4_))) {
    local_b8._0_4_ = uc;
    auVar8 = vminss_avx(ZEXT416((uint)(this->mfDistrib).alpha_y),
                        ZEXT416((uint)(this->mfDistrib).alpha_x));
    auVar27 = (undefined1  [60])0x0;
    local_c8.z = (float)local_78._0_4_;
    if (0.001 <= auVar8._0_4_) {
      local_48._8_8_ = local_48._0_8_;
      local_48._0_8_ = &this->mfDistrib;
      VVar31 = TrowbridgeReitzDistribution::Sample_wm(&this->mfDistrib,(Vector3f *)&local_c8,u);
      local_d8.z = VVar31.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar18._0_8_ = VVar31.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar18._8_56_ = auVar17._8_56_;
      local_d8._0_8_ = vmovlps_avx(auVar18._0_16_);
      VVar31 = Reflect((Vector3f *)&local_c8,(Vector3f *)&local_d8);
      auVar19._0_8_ = VVar31.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar19._8_56_ = auVar17._8_56_;
      ft.values.values[0] = 0.0;
      ft.values.values[1] = 0.0;
      ft.values.values[2] = 1.0;
      auVar24 = auVar17._8_56_;
      VVar32 = FaceForward<float>((Vector3<float> *)&local_d8,(Vector3<float> *)&ft);
      auVar25._0_4_ = VVar32.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar25._4_60_ = auVar27;
      auVar20._0_8_ = VVar32.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar20._8_56_ = auVar24;
      auVar29._0_4_ =
           VVar31.super_Tuple3<pbrt::Vector3,_float>.x * VVar32.super_Tuple3<pbrt::Vector3,_float>.x
      ;
      auVar29._4_4_ =
           VVar31.super_Tuple3<pbrt::Vector3,_float>.y * VVar32.super_Tuple3<pbrt::Vector3,_float>.y
      ;
      auVar29._8_4_ = auVar17._8_4_ * auVar24._0_4_;
      auVar29._12_4_ = auVar17._12_4_ * auVar24._4_4_;
      auVar8 = vmovshdup_avx(auVar29);
      auVar8 = vfmadd231ss_fma(auVar8,auVar19._0_16_,auVar20._0_16_);
      auVar8 = vfmadd231ss_fma(auVar8,auVar25._0_16_,
                               ZEXT416((uint)VVar31.super_Tuple3<pbrt::Vector3,_float>.z));
      FVar9 = FrDielectric(auVar8._0_4_,this->eta);
      auVar17._8_56_ = extraout_var._4_56_;
      fVar11 = (float)((uint)((byte)sampleFlags & 1) * (int)FVar9);
      auVar8._4_12_ = extraout_var._0_12_;
      auVar8._0_4_ = fVar11;
      fVar2 = (float)((uint)((sampleFlags & Transmission) != Unset) * (int)(1.0 - FVar9));
      if (((fVar11 != 0.0) || (fVar2 != 0.0)) || (NAN(fVar2))) {
        fVar28 = fVar11 + fVar2;
        if (fVar11 / fVar28 <= (float)local_b8._0_4_) {
          uVar1 = vcmpss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_c8.z),1);
          bVar6 = (bool)((byte)uVar1 & 1);
          local_58.x = 0.0;
          local_58.y = 0.0;
          local_58.z = 0.0;
          ft.values.values[0] = local_d8.x;
          ft.values.values[1] = local_d8.y;
          ft.values.values[2] = local_d8.z;
          FVar10 = (Float)((uint)bVar6 * (int)this->eta + (uint)!bVar6 * (int)(1.0 / this->eta));
          local_b8 = ZEXT416((uint)FVar10);
          bVar6 = Refract((Vector3f *)&local_c8,(Normal3f *)&ft,FVar10,(Vector3f *)&local_58);
          if ((Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
               ::reg == '\0') &&
             (iVar7 = __cxa_guard_acquire(&Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                           ::reg), iVar7 != 0)) {
            StatRegisterer::StatRegisterer
                      ((StatRegisterer *)
                       &Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                        ::reg,const::{lambda(pbrt::StatsAccumulator&)#3}::StatsAccumulator__,
                       (PixelAccumFunc)0x0);
            __cxa_guard_release(&Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                 ::reg);
          }
          *(long *)(in_FS_OFFSET + -0xb0) = *(long *)(in_FS_OFFSET + -0xb0) + 1;
          if (!bVar6) {
            *(long *)(in_FS_OFFSET + -0xb8) = *(long *)(in_FS_OFFSET + -0xb8) + 1;
          }
          auVar17._8_56_ = (undefined1  [56])0x0;
          auVar27 = ZEXT1260(SUB1612(ZEXT816(0) << 0x40,4));
          if ((local_58.z * local_c8.z <= 0.0) && (bVar6 && local_58.z != 0.0)) {
            ft.values.values[0] = 0.0;
            ft.values.values[1] = 0.0;
            ft.values.values[2] = 1.0;
            VVar32 = FaceForward<float>((Vector3<float> *)&local_d8,(Normal3<float> *)&ft);
            auVar26._0_4_ = VVar32.super_Tuple3<pbrt::Vector3,_float>.z;
            auVar26._4_60_ = auVar27;
            auVar23._0_8_ = VVar32.super_Tuple3<pbrt::Vector3,_float>._0_8_;
            auVar23._8_56_ = auVar17._8_56_;
            auVar16 = auVar23._0_16_;
            auVar8 = vmovshdup_avx(auVar16);
            local_d8._0_8_ = vmovlps_avx(auVar16);
            uVar1 = local_48._0_8_;
            auVar29 = vfmadd231ss_fma(ZEXT416((uint)(auVar8._0_4_ * local_c8.y)),auVar16,
                                      ZEXT416((uint)local_c8.x));
            auVar8 = vfmadd231ss_fma(ZEXT416((uint)(auVar8._0_4_ * local_58.y)),auVar16,
                                     ZEXT416((uint)local_58.x));
            auVar29 = vfmadd231ss_fma(auVar29,auVar26._0_16_,ZEXT416((uint)local_c8.z));
            auVar8 = vfmadd231ss_fma(auVar8,auVar26._0_16_,ZEXT416((uint)local_58.z));
            fVar11 = 1.0 / local_b8._0_4_;
            auVar8 = vfmadd213ss_fma(auVar8,local_b8,auVar29);
            local_9c = auVar8._0_4_;
            local_d8.z = auVar26._0_4_;
            FVar10 = TrowbridgeReitzDistribution::D
                               ((TrowbridgeReitzDistribution *)local_48._0_8_,(Vector3f *)&local_d8)
            ;
            FVar12 = TrowbridgeReitzDistribution::G
                               ((TrowbridgeReitzDistribution *)uVar1,(Vector3f *)&local_c8,
                                (Vector3f *)&local_58);
            fVar13 = AbsDot<float>((Vector3<float> *)&local_58,(Vector3<float> *)&local_d8);
            fVar14 = AbsDot<float>((Vector3<float> *)&local_c8,(Vector3<float> *)&local_d8);
            auVar30._8_4_ = 0x7fffffff;
            auVar30._0_8_ = 0x7fffffff7fffffff;
            auVar30._12_4_ = 0x7fffffff;
            auVar8 = vandps_avx(ZEXT416((uint)(local_58.z * local_c8.z)),auVar30);
            auVar16._0_4_ =
                 (fVar14 * fVar13 * FVar12 * FVar10) / (local_9c * local_9c * auVar8._0_4_);
            auVar16._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar8 = vandps_avx(auVar16,auVar30);
            SampledSpectrum::SampledSpectrum
                      (&ft,auVar8._0_4_ *
                           (float)((uint)(mode == Radiance) * (int)(fVar11 * fVar11) +
                                  (uint)(mode != Radiance) * 0x3f800000) * (1.0 - FVar9));
            fVar11 = AbsDot<float>((Vector3<float> *)&local_58,(Vector3<float> *)&local_d8);
            auVar8 = vfmadd231ss_fma(ZEXT416((uint)(local_d8.y * local_c8.y)),
                                     ZEXT416((uint)local_d8.x),ZEXT416((uint)local_c8.x));
            auVar29 = vfmadd231ss_fma(ZEXT416((uint)(local_d8.y * local_58.y)),
                                      ZEXT416((uint)local_d8.x),ZEXT416((uint)local_58.x));
            auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)local_d8.z),ZEXT416((uint)local_c8.z));
            auVar29 = vfmadd231ss_fma(auVar29,ZEXT416((uint)local_d8.z),ZEXT416((uint)local_58.z));
            auVar8 = vfmadd132ss_fma(auVar29,auVar8,ZEXT416((uint)local_b8._0_4_));
            local_b8._0_4_ = fVar11 / (auVar8._0_4_ * auVar8._0_4_);
            FVar9 = TrowbridgeReitzDistribution::PDF
                              ((TrowbridgeReitzDistribution *)uVar1,(Vector3f *)&local_c8,
                               (Vector3f *)&local_d8);
            fVar28 = (FVar9 * (float)local_b8._0_4_ * fVar2) / fVar28;
            if (!NAN(fVar28)) {
              *(undefined8 *)(__return_storage_ptr__->f).values.values = ft.values.values._0_8_;
              *(ulong *)((__return_storage_ptr__->f).values.values + 2) =
                   CONCAT44(ft.values.values[3],ft.values.values[2]);
              (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.x = local_58.x;
              (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.y = local_58.y;
              (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.z = local_58.z;
              __return_storage_ptr__->pdf = fVar28;
              __return_storage_ptr__->flags = GlossyTransmission;
              return __return_storage_ptr__;
            }
            LogFatal<char_const(&)[12]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/bxdfs.h"
                       ,0x17a,"Check failed: %s",(char (*) [12])"!IsNaN(pdf)");
          }
        }
        else {
          local_b8 = auVar8;
          VVar31 = Reflect((Vector3f *)&local_c8,(Vector3f *)&local_d8);
          ft.values.values[2] = VVar31.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar21._0_8_ = VVar31.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar21._8_56_ = auVar17._8_56_;
          ft.values.values._0_8_ = vmovlps_avx(auVar21._0_16_);
          if ((Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
               ::reg == '\0') &&
             (iVar7 = __cxa_guard_acquire(&Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                           ::reg), iVar7 != 0)) {
            StatRegisterer::StatRegisterer
                      ((StatRegisterer *)
                       &Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                        ::reg,const::{lambda(pbrt::StatsAccumulator&)#2}::StatsAccumulator__,
                       (PixelAccumFunc)0x0);
            __cxa_guard_release(&Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                 ::reg);
          }
          fVar11 = ft.values.values[2];
          *(long *)(in_FS_OFFSET + -0xc0) = *(long *)(in_FS_OFFSET + -0xc0) + 1;
          auVar8 = vfmadd231ss_fma(ZEXT416((uint)(local_c8.y * local_d8.y)),
                                   ZEXT416((uint)local_c8.x),ZEXT416((uint)local_d8.x));
          auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)local_c8.z),ZEXT416((uint)local_d8.z));
          if (auVar8._0_4_ <= 0.0) {
            *(long *)(in_FS_OFFSET + -200) = *(long *)(in_FS_OFFSET + -200) + 1;
          }
          else if (0.0 < local_c8.z * ft.values.values[2]) {
            auVar29 = ZEXT416((uint)ft.values.values[2]);
            FVar10 = TrowbridgeReitzDistribution::PDF
                               ((TrowbridgeReitzDistribution *)local_48._0_8_,(Vector3f *)&local_c8,
                                (Vector3f *)&local_d8);
            auVar8 = vfmadd231ss_fma(ZEXT416((uint)(local_c8.y * local_d8.y)),
                                     ZEXT416((uint)local_c8.x),ZEXT416((uint)local_d8.x));
            auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)local_c8.z),ZEXT416((uint)local_d8.z));
            fVar28 = ((FVar10 / (auVar8._0_4_ * 4.0)) * (float)local_b8._0_4_) / fVar28;
            if (NAN(fVar28)) {
              LogFatal<char_const(&)[12]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/bxdfs.h"
                         ,0x150,"Check failed: %s",(char (*) [12])"!IsNaN(pdf)");
            }
            if (((local_c8.z != 0.0) || (NAN(local_c8.z))) && ((fVar11 != 0.0 || (NAN(fVar11))))) {
              auVar15._8_4_ = 0x7fffffff;
              auVar15._0_8_ = 0x7fffffff7fffffff;
              auVar15._12_4_ = 0x7fffffff;
              uVar1 = local_48._0_8_;
              local_b8._0_4_ = fVar28;
              auVar8 = vandps_avx(ZEXT416((uint)local_c8.z),auVar15);
              auVar29 = vandps_avx(auVar29,auVar15);
              local_9c = TrowbridgeReitzDistribution::D
                                   ((TrowbridgeReitzDistribution *)local_48._0_8_,
                                    (Vector3f *)&local_d8);
              FVar10 = TrowbridgeReitzDistribution::G
                                 ((TrowbridgeReitzDistribution *)uVar1,(Vector3f *)&local_c8,
                                  (Vector3f *)&ft);
              local_68 = auVar29._0_4_;
              local_78._0_4_ = auVar8._0_4_;
              SampledSpectrum::SampledSpectrum
                        (&__return_storage_ptr__->f,
                         (FVar10 * local_9c * FVar9) / (local_68 * 4.0 * (float)local_78._0_4_));
              (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.z =
                   ft.values.values[2];
              (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.x =
                   ft.values.values[0];
              (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.y =
                   ft.values.values[1];
              __return_storage_ptr__->pdf = (Float)local_b8._0_4_;
              __return_storage_ptr__->flags = GlossyReflection;
              return __return_storage_ptr__;
            }
          }
        }
      }
    }
    else {
      local_78._4_4_ = in_XMM1_Db;
      local_78._8_4_ = 0;
      local_78._12_4_ = in_XMM1_Dd;
      FVar9 = FrDielectric((Float)local_78._0_4_,this->eta);
      fVar11 = (float)((uint)((byte)sampleFlags & 1) * (int)FVar9);
      local_48 = ZEXT416((uint)(1.0 - FVar9));
      fVar2 = (float)((uint)((sampleFlags & Transmission) != Unset) * (int)(1.0 - FVar9));
      if (((fVar11 != 0.0) || (fVar2 != 0.0)) || (NAN(fVar2))) {
        fVar28 = fVar11 / (fVar11 + fVar2);
        if ((float)local_b8._0_4_ < fVar28) {
          auVar3._8_4_ = 0x80000000;
          auVar3._0_8_ = 0x8000000080000000;
          auVar3._12_4_ = 0x80000000;
          local_b8 = vxorps_avx512vl(auVar17._0_16_,auVar3);
          auVar4._8_4_ = 0x7fffffff;
          auVar4._0_8_ = 0x7fffffff7fffffff;
          auVar4._12_4_ = 0x7fffffff;
          auVar8 = vandps_avx512vl(local_78,auVar4);
          SampledSpectrum::SampledSpectrum(&__return_storage_ptr__->f,FVar9 / auVar8._0_4_);
          uVar1 = vmovlps_avx(local_b8);
          (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
          (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.y =
               (float)(int)((ulong)uVar1 >> 0x20);
          (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.z = (float)local_78._0_4_;
          __return_storage_ptr__->pdf = fVar28;
          __return_storage_ptr__->flags = SpecularReflection;
          return __return_storage_ptr__;
        }
        auVar17._8_56_ = (undefined1  [56])0x0;
        local_d8.x = 0.0;
        local_d8.y = 0.0;
        local_58.x = 0.0;
        local_58.y = 0.0;
        local_d8.z = 0.0;
        local_58.z = 1.0;
        uVar1 = vcmpss_avx512f(ZEXT816(0),ZEXT416((uint)local_78._0_4_),1);
        bVar6 = (bool)((byte)uVar1 & 1);
        local_b8 = ZEXT416((uint)bVar6 * (int)this->eta + (uint)!bVar6 * (int)(1.0 / this->eta));
        NVar33 = FaceForward<float>((Normal3<float> *)&local_58,(Vector3<float> *)&local_c8);
        ft.values.values[2] = NVar33.super_Tuple3<pbrt::Normal3,_float>.z;
        auVar22._0_8_ = NVar33.super_Tuple3<pbrt::Normal3,_float>._0_8_;
        auVar22._8_56_ = auVar17._8_56_;
        ft.values.values._0_8_ = vmovlps_avx(auVar22._0_16_);
        bVar6 = Refract((Vector3f *)&local_c8,(Normal3f *)&ft,(Float)local_b8._0_4_,
                        (Vector3f *)&local_d8);
        if ((Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
             ::reg == '\0') &&
           (iVar7 = __cxa_guard_acquire(&Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                         ::reg), iVar7 != 0)) {
          StatRegisterer::StatRegisterer
                    ((StatRegisterer *)
                     &Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                      ::reg,const::{lambda(pbrt::StatsAccumulator&)#1}::StatsAccumulator__,
                     (PixelAccumFunc)0x0);
          __cxa_guard_release(&Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                               ::reg);
        }
        *(long *)(in_FS_OFFSET + -0xd0) = *(long *)(in_FS_OFFSET + -0xd0) + 1;
        if (bVar6) {
          auVar5._8_4_ = 0x7fffffff;
          auVar5._0_8_ = 0x7fffffff7fffffff;
          auVar5._12_4_ = 0x7fffffff;
          auVar8 = vandps_avx512vl(ZEXT416((uint)local_d8.z),auVar5);
          SampledSpectrum::SampledSpectrum(&ft,(float)local_48._0_4_ / auVar8._0_4_);
          if (mode == Radiance) {
            SampledSpectrum::operator/=(&ft,(float)local_b8._0_4_ * (float)local_b8._0_4_);
          }
          *(undefined8 *)(__return_storage_ptr__->f).values.values = ft.values.values._0_8_;
          *(ulong *)((__return_storage_ptr__->f).values.values + 2) =
               CONCAT44(ft.values.values[3],ft.values.values[2]);
          (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.x = local_d8.x;
          (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.y = local_d8.y;
          (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.z = local_d8.z;
          __return_storage_ptr__->pdf = fVar2 / (fVar11 + fVar2);
          __return_storage_ptr__->flags = SpecularTransmission;
          return __return_storage_ptr__;
        }
        *(long *)(in_FS_OFFSET + -0xd8) = *(long *)(in_FS_OFFSET + -0xd8) + 1;
      }
    }
  }
  __return_storage_ptr__->flags = Unset;
  (__return_storage_ptr__->f).values.values[0] = 0.0;
  (__return_storage_ptr__->f).values.values[1] = 0.0;
  (__return_storage_ptr__->f).values.values[2] = 0.0;
  (__return_storage_ptr__->f).values.values[3] = 0.0;
  (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  *(undefined8 *)&(__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.z = 0;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    BSDFSample Sample_f(Vector3f wo, Float uc, const Point2f &u, TransportMode mode,
                        BxDFReflTransFlags sampleFlags = BxDFReflTransFlags::All) const {
        if (wo.z == 0)
            return {};

        if (mfDistrib.EffectivelySpecular()) {
            // Sample delta dielectric interface
            Float R = FrDielectric(CosTheta(wo), eta), T = 1 - R;
            // Compute probabilities _pr_ and _pt_ for sampling reflection and
            // transmission
            Float pr = R, pt = T;
            if (!(sampleFlags & BxDFReflTransFlags::Reflection))
                pr = 0;
            if (!(sampleFlags & BxDFReflTransFlags::Transmission))
                pt = 0;
            if (pr == 0 && pt == 0)
                return {};

            if (uc < pr / (pr + pt)) {
                // Sample perfect specular reflection at interface
                Vector3f wi(-wo.x, -wo.y, wo.z);
                SampledSpectrum fr(R / AbsCosTheta(wi));
                return BSDFSample(fr, wi, pr / (pr + pt), BxDFFlags::SpecularReflection);

            } else {
                // Sample perfect specular transmission at interface
                // Figure out which $\eta$ is incident and which is transmitted
                bool entering = CosTheta(wo) > 0;
                Float etap = entering ? eta : (1 / eta);

                // Compute ray direction for specular transmission
                Vector3f wi;
                bool tir = !Refract(wo, FaceForward(Normal3f(0, 0, 1), wo), etap, &wi);
                CHECK_RARE(1e-6, tir);
                if (tir)
                    return {};

                SampledSpectrum ft(T / AbsCosTheta(wi));
                // Account for non-symmetry with transmission to different medium
                if (mode == TransportMode::Radiance)
                    ft /= Sqr(etap);

                return BSDFSample(ft, wi, pt / (pr + pt),
                                  BxDFFlags::SpecularTransmission);
            }

        } else {
            // Sample non-delta dielectric interface
            // Sample half-angle vector for outgoing direction and compute Frensel factor
            Vector3f wh = mfDistrib.Sample_wm(wo, u);
            Float F = FrDielectric(
                Dot(Reflect(wo, wh), FaceForward(wh, Vector3f(0, 0, 1))), eta);
            Float R = F, T = 1 - R;

            // Compute probabilities _pr_ and _pt_ for sampling reflection and
            // transmission
            Float pr = R, pt = T;
            if (!(sampleFlags & BxDFReflTransFlags::Reflection))
                pr = 0;
            if (!(sampleFlags & BxDFReflTransFlags::Transmission))
                pt = 0;
            if (pr == 0 && pt == 0)
                return {};

            if (uc < pr / (pr + pt)) {
                // Sample reflection at non-delta dielectric interface
                Vector3f wi = Reflect(wo, wh);
                CHECK_RARE(1e-6, Dot(wo, wh) <= 0);
                if (!SameHemisphere(wo, wi) || Dot(wo, wh) <= 0)
                    return {};

                // Compute PDF of _wi_ for microfacet reflection
                Float pdf = mfDistrib.PDF(wo, wh) / (4 * Dot(wo, wh)) * pr / (pr + pt);
                CHECK(!IsNaN(pdf));

                // TODO: reuse fragments from f()
                Float cosTheta_o = AbsCosTheta(wo), cosTheta_i = AbsCosTheta(wi);
                // Handle degenerate cases for microfacet reflection
                if (cosTheta_i == 0 || cosTheta_o == 0)
                    return {};
                SampledSpectrum f(mfDistrib.D(wh) * mfDistrib.G(wo, wi) * F /
                                  (4 * cosTheta_i * cosTheta_o));
                return BSDFSample(f, wi, pdf, BxDFFlags::GlossyReflection);

            } else {
                // Sample transmission at non-delta dielectric interface
                // FIXME (make consistent): this etap is 1/etap as used in
                // specular...
                Float etap = CosTheta(wo) > 0 ? eta : (1 / eta);
                Vector3f wi;
                bool tir = !Refract(wo, (Normal3f)wh, etap, &wi);
                CHECK_RARE(1e-6, tir);
                if (SameHemisphere(wo, wi))
                    return {};
                if (tir || wi.z == 0)
                    return {};

                // Evaluate BSDF
                // TODO: share fragments with f(), PDF()...
                wh = FaceForward(wh, Normal3f(0, 0, 1));

                Float sqrtDenom = Dot(wo, wh) + etap * Dot(wi, wh);
                Float factor = (mode == TransportMode::Radiance) ? Sqr(1 / etap) : 1;

                SampledSpectrum f(
                    (1 - F) * factor *
                    std::abs(mfDistrib.D(wh) * mfDistrib.G(wo, wi) * AbsDot(wi, wh) *
                             AbsDot(wo, wh) /
                             (AbsCosTheta(wi) * AbsCosTheta(wo) * Sqr(sqrtDenom))));

                // Compute PDF
                Float dwh_dwi =
                    /*Sqr(etap) * */ AbsDot(wi, wh) /
                    Sqr(Dot(wo, wh) + etap * Dot(wi, wh));
                Float pdf = mfDistrib.PDF(wo, wh) * dwh_dwi * pt / (pr + pt);
                CHECK(!IsNaN(pdf));

                return BSDFSample(f, wi, pdf, BxDFFlags::GlossyTransmission);
            }
        }
    }